

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::~Value(Value *this)

{
  Value *this_local;
  
  releasePayload(this);
  (this->value_).int_ = 0;
  Comments::~Comments(&this->comments_);
  return;
}

Assistant:

Value::~Value() {
  releasePayload();
  value_.uint_ = 0;
}